

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_sorter.cpp
# Opt level: O1

void __thiscall duckdb::MergeSorter::ComputeMerge(MergeSorter *this,idx_t *count,bool *left_smaller)

{
  unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true> *this_00;
  unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true> *this_01;
  idx_t iVar1;
  ulong uVar2;
  ulong uVar3;
  SortedBlock *this_02;
  SortedBlock *pSVar4;
  data_ptr_t pdVar5;
  data_ptr_t pdVar6;
  uint uVar7;
  type pSVar8;
  type pSVar9;
  reference pvVar10;
  pointer pRVar11;
  pointer pSVar12;
  type pSVar13;
  type left;
  type right;
  ulong uVar14;
  data_ptr_t str1;
  data_ptr_t str2;
  idx_t iVar15;
  ulong uVar16;
  bool bVar17;
  bool bVar18;
  data_ptr_t local_90;
  data_ptr_t local_88;
  SortedBlock *local_80;
  SortedBlock *local_78;
  bool *local_70;
  unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true> *local_68;
  unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true> *local_60;
  idx_t local_58;
  idx_t iStack_50;
  idx_t local_48;
  idx_t iStack_40;
  
  this_00 = &this->left;
  local_70 = left_smaller;
  pSVar8 = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>::
           operator*(this_00);
  this_01 = &this->right;
  pSVar9 = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>::
           operator*(this_01);
  local_78 = pSVar8->sb;
  local_80 = pSVar9->sb;
  local_58 = pSVar8->block_idx;
  iStack_50 = pSVar8->entry_idx;
  local_48 = pSVar9->block_idx;
  iStack_40 = pSVar9->entry_idx;
  local_60 = &local_78->blob_sorting_data;
  local_68 = &local_80->blob_sorting_data;
  uVar16 = 0;
  do {
    pSVar4 = local_78;
    this_02 = local_80;
    if (*count <= uVar16) break;
    if (pSVar8->block_idx <
        (ulong)((long)(local_78->radix_sorting_data).
                      super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(local_78->radix_sorting_data).
                      super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3)) {
      iVar1 = pSVar8->entry_idx;
      pvVar10 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                ::operator[](&local_78->radix_sorting_data,pSVar8->block_idx);
      pRVar11 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
                operator->(pvVar10);
      if (iVar1 == pRVar11->count) {
        pSVar8->block_idx = pSVar8->block_idx + 1;
        pSVar8->entry_idx = 0;
      }
    }
    if (pSVar9->block_idx <
        (ulong)((long)(this_02->radix_sorting_data).
                      super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this_02->radix_sorting_data).
                      super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3)) {
      iVar1 = pSVar9->entry_idx;
      pvVar10 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                ::operator[](&this_02->radix_sorting_data,pSVar9->block_idx);
      pRVar11 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
                operator->(pvVar10);
      if (iVar1 == pRVar11->count) {
        pSVar9->block_idx = pSVar9->block_idx + 1;
        pSVar9->entry_idx = 0;
      }
    }
    bVar17 = pSVar8->block_idx !=
             (long)(pSVar4->radix_sorting_data).
                   super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(pSVar4->radix_sorting_data).
                   super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3;
    bVar18 = pSVar9->block_idx !=
             (long)(this_02->radix_sorting_data).
                   super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this_02->radix_sorting_data).
                   super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3;
    pdVar5 = local_90;
    pdVar6 = local_88;
    if (bVar18 && bVar17) {
      pSVar12 = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>::
                operator->(this_00);
      SBScanState::PinRadix(pSVar12,pSVar8->block_idx);
      pSVar12 = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>::
                operator->(this_00);
      optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&(pSVar12->radix_handle).node);
      str1 = ((pSVar12->radix_handle).node.ptr)->buffer +
             pSVar12->sort_layout->entry_size * pSVar12->entry_idx;
      local_88 = str1;
      pSVar12 = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>::
                operator->(this_01);
      SBScanState::PinRadix(pSVar12,pSVar9->block_idx);
      pSVar12 = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>::
                operator->(this_01);
      optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&(pSVar12->radix_handle).node);
      str2 = ((pSVar12->radix_handle).node.ptr)->buffer +
             pSVar12->sort_layout->entry_size * pSVar12->entry_idx;
      local_90 = str2;
      pvVar10 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                ::operator[](&local_78->radix_sorting_data,pSVar8->block_idx);
      pRVar11 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
                operator->(pvVar10);
      uVar2 = pRVar11->count;
      pvVar10 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                ::operator[](&local_80->radix_sorting_data,pSVar9->block_idx);
      pRVar11 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
                operator->(pvVar10);
      uVar3 = pRVar11->count;
      if (this->sort_layout->all_constant == true) {
        pdVar5 = str2;
        pdVar6 = str1;
        if ((uVar16 < *count) && (pSVar8->entry_idx < uVar2)) {
          uVar14 = pSVar9->entry_idx;
          while (pdVar5 = str2, pdVar6 = str1, uVar14 < uVar3) {
            uVar7 = FastMemcmp(str1,str2,this->sort_layout->comparison_size);
            local_70[uVar16] = SUB41(uVar7 >> 0x1f,0);
            pSVar8->entry_idx = pSVar8->entry_idx + (ulong)(uVar7 >> 0x1f);
            uVar14 = (ulong)(-1 < (int)uVar7) + pSVar9->entry_idx;
            pSVar9->entry_idx = uVar14;
            iVar1 = this->sort_layout->entry_size;
            iVar15 = 0;
            if (-1 < (int)uVar7) {
              iVar15 = iVar1;
            }
            str1 = str1 + iVar1 * (uVar7 >> 0x1f);
            str2 = str2 + iVar15;
            uVar16 = uVar16 + 1;
            pdVar5 = str2;
            pdVar6 = str1;
            if ((*count <= uVar16) || (uVar2 <= pSVar8->entry_idx)) break;
          }
        }
      }
      else {
        pSVar12 = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>::
                  operator->(this_00);
        pSVar13 = unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>::
                  operator*(local_60);
        SBScanState::PinData(pSVar12,pSVar13);
        pSVar12 = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>::
                  operator->(this_01);
        pSVar13 = unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>::
                  operator*(local_68);
        SBScanState::PinData(pSVar12,pSVar13);
        pdVar5 = local_90;
        pdVar6 = local_88;
        if ((uVar16 < *count) && (pSVar8->entry_idx < uVar2)) {
          while (pdVar5 = local_90, pdVar6 = local_88, pSVar9->entry_idx < uVar3) {
            left = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>::
                   operator*(this_00);
            right = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>
                    ::operator*(this_01);
            uVar7 = Comparators::CompareTuple
                              (left,right,&local_88,&local_90,this->sort_layout,
                               &this->state->external);
            local_70[uVar16] = SUB41(uVar7 >> 0x1f,0);
            pSVar8->entry_idx = pSVar8->entry_idx + (ulong)(uVar7 >> 0x1f);
            pSVar9->entry_idx = pSVar9->entry_idx + (ulong)(-1 < (int)uVar7);
            iVar1 = this->sort_layout->entry_size;
            iVar15 = 0;
            if (-1 < (int)uVar7) {
              iVar15 = iVar1;
            }
            str1 = str1 + iVar1 * (uVar7 >> 0x1f);
            str2 = str2 + iVar15;
            uVar16 = uVar16 + 1;
            pdVar5 = str2;
            pdVar6 = str1;
            if ((*count <= uVar16) || (local_90 = str2, local_88 = str1, uVar2 <= pSVar8->entry_idx)
               ) break;
          }
        }
      }
    }
    local_88 = pdVar6;
    local_90 = pdVar5;
  } while (bVar18 && bVar17);
  pSVar12 = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>::
            operator->(this_00);
  pSVar12->block_idx = local_58;
  pSVar12->entry_idx = iStack_50;
  pSVar12 = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>::
            operator->(this_01);
  pSVar12->block_idx = local_48;
  pSVar12->entry_idx = iStack_40;
  return;
}

Assistant:

void MergeSorter::ComputeMerge(const idx_t &count, bool left_smaller[]) {
	auto &l = *left;
	auto &r = *right;
	auto &l_sorted_block = *l.sb;
	auto &r_sorted_block = *r.sb;
	// Save indices to restore afterwards
	idx_t l_block_idx_before = l.block_idx;
	idx_t l_entry_idx_before = l.entry_idx;
	idx_t r_block_idx_before = r.block_idx;
	idx_t r_entry_idx_before = r.entry_idx;
	// Data pointers for both sides
	data_ptr_t l_radix_ptr;
	data_ptr_t r_radix_ptr;
	// Compute the merge of the next 'count' tuples
	idx_t compared = 0;
	while (compared < count) {
		// Move to the next block (if needed)
		if (l.block_idx < l_sorted_block.radix_sorting_data.size() &&
		    l.entry_idx == l_sorted_block.radix_sorting_data[l.block_idx]->count) {
			l.block_idx++;
			l.entry_idx = 0;
		}
		if (r.block_idx < r_sorted_block.radix_sorting_data.size() &&
		    r.entry_idx == r_sorted_block.radix_sorting_data[r.block_idx]->count) {
			r.block_idx++;
			r.entry_idx = 0;
		}
		const bool l_done = l.block_idx == l_sorted_block.radix_sorting_data.size();
		const bool r_done = r.block_idx == r_sorted_block.radix_sorting_data.size();
		if (l_done || r_done) {
			// One of the sides is exhausted, no need to compare
			break;
		}
		// Pin the radix sorting data
		left->PinRadix(l.block_idx);
		l_radix_ptr = left->RadixPtr();
		right->PinRadix(r.block_idx);
		r_radix_ptr = right->RadixPtr();

		const idx_t l_count = l_sorted_block.radix_sorting_data[l.block_idx]->count;
		const idx_t r_count = r_sorted_block.radix_sorting_data[r.block_idx]->count;
		// Compute the merge
		if (sort_layout.all_constant) {
			// All sorting columns are constant size
			for (; compared < count && l.entry_idx < l_count && r.entry_idx < r_count; compared++) {
				left_smaller[compared] = FastMemcmp(l_radix_ptr, r_radix_ptr, sort_layout.comparison_size) < 0;
				const bool &l_smaller = left_smaller[compared];
				const bool r_smaller = !l_smaller;
				// Use comparison bool (0 or 1) to increment entries and pointers
				l.entry_idx += l_smaller;
				r.entry_idx += r_smaller;
				l_radix_ptr += l_smaller * sort_layout.entry_size;
				r_radix_ptr += r_smaller * sort_layout.entry_size;
			}
		} else {
			// Pin the blob data
			left->PinData(*l_sorted_block.blob_sorting_data);
			right->PinData(*r_sorted_block.blob_sorting_data);
			// Merge with variable size sorting columns
			for (; compared < count && l.entry_idx < l_count && r.entry_idx < r_count; compared++) {
				left_smaller[compared] =
				    Comparators::CompareTuple(*left, *right, l_radix_ptr, r_radix_ptr, sort_layout, state.external) < 0;
				const bool &l_smaller = left_smaller[compared];
				const bool r_smaller = !l_smaller;
				// Use comparison bool (0 or 1) to increment entries and pointers
				l.entry_idx += l_smaller;
				r.entry_idx += r_smaller;
				l_radix_ptr += l_smaller * sort_layout.entry_size;
				r_radix_ptr += r_smaller * sort_layout.entry_size;
			}
		}
	}
	// Reset block indices
	left->SetIndices(l_block_idx_before, l_entry_idx_before);
	right->SetIndices(r_block_idx_before, r_entry_idx_before);
}